

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brktrans.cpp
# Opt level: O1

void __thiscall
icu_63::BreakTransliterator::handleTransliterate
          (BreakTransliterator *this,Replaceable *text,UTransPosition *offsets,UBool isIncremental)

{
  UnicodeString *pUVar1;
  short sVar2;
  byte bVar3;
  UBool UVar4;
  int iVar5;
  UChar32 UVar6;
  uint uVar7;
  Locale *key;
  BreakIterator *pBVar8;
  UVector32 *this_00;
  undefined7 in_register_00000009;
  int iVar9;
  Replaceable *status_00;
  int iVar10;
  UErrorCode status;
  UnicodeString sText;
  undefined1 local_8c [12];
  UTransPosition *local_80;
  undefined4 local_74;
  UnicodeString local_70;
  
  local_74 = (undefined4)CONCAT71(in_register_00000009,isIncremental);
  local_8c._0_4_ = U_ZERO_ERROR;
  status_00 = text;
  local_80 = offsets;
  umtx_lock_63((UMutex *)0x0);
  pBVar8 = (this->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>.ptr;
  this_00 = (this->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>.ptr;
  (this->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>.ptr = (BreakIterator *)0x0;
  (this->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>.ptr = (UVector32 *)0x0;
  umtx_unlock_63((UMutex *)0x0);
  if (pBVar8 == (BreakIterator *)0x0) {
    key = Locale::getEnglish();
    status_00 = (Replaceable *)local_8c;
    pBVar8 = BreakIterator::createWordInstance(key,(UErrorCode *)status_00);
  }
  if (this_00 == (UVector32 *)0x0) {
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)status_00);
    if (this_00 == (UVector32 *)0x0) {
      this_00 = (UVector32 *)0x0;
    }
    else {
      UVector32::UVector32(this_00,(UErrorCode *)local_8c);
    }
  }
  if (((pBVar8 != (BreakIterator *)0x0) && (this_00 != (UVector32 *)0x0)) &&
     ((int)local_8c._0_4_ < U_ILLEGAL_ARGUMENT_ERROR)) {
    UVector32::removeAllElements(this_00);
    replaceableAsString(&local_70,text);
    (*(pBVar8->super_UObject)._vptr_UObject[7])(pBVar8,&local_70);
    (*(pBVar8->super_UObject)._vptr_UObject[0x10])(pBVar8,(ulong)(uint)local_80->start);
    local_8c._4_8_ = this;
    iVar5 = (*(pBVar8->super_UObject)._vptr_UObject[0xd])();
    while ((iVar5 != -1 && (iVar5 < local_80->limit))) {
      if (iVar5 != 0) {
        UVar6 = icu_63::UnicodeString::char32At(&local_70,iVar5 + -1);
        bVar3 = u_charType_63(UVar6);
        if ((0x1feU >> (bVar3 & 0x1f) & 1) != 0) {
          UVar6 = icu_63::UnicodeString::char32At(&local_70,iVar5);
          bVar3 = u_charType_63(UVar6);
          if (((0x1feU >> (bVar3 & 0x1f) & 1) != 0) &&
             (((iVar10 = this_00->count, -2 < iVar10 && (iVar10 < this_00->capacity)) ||
              (UVar4 = UVector32::expandCapacity(this_00,iVar10 + 1,(UErrorCode *)local_8c),
              UVar4 != '\0')))) {
            this_00->elements[this_00->count] = iVar5;
            this_00->count = this_00->count + 1;
          }
        }
      }
      iVar5 = (*(pBVar8->super_UObject)._vptr_UObject[0xd])();
    }
    uVar7 = this_00->count;
    if ((ulong)uVar7 == 0) {
      iVar5 = 0;
      iVar10 = 0;
    }
    else {
      sVar2 = (((UnicodeString *)(local_8c._4_8_ + 0x68))->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar5 = (((UnicodeString *)(local_8c._4_8_ + 0x68))->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      if ((int)uVar7 < 1) {
        iVar10 = 0;
      }
      else {
        iVar10 = this_00->elements[(ulong)uVar7 - 1];
      }
      pUVar1 = (UnicodeString *)(local_8c._4_8_ + 0x68);
      iVar5 = iVar5 * uVar7;
      while (0 < this_00->count) {
        uVar7 = this_00->count - 1;
        this_00->count = uVar7;
        (*(text->super_UObject)._vptr_UObject[4])
                  (text,(ulong)(uint)this_00->elements[uVar7],(ulong)(uint)this_00->elements[uVar7],
                   pUVar1);
      }
    }
    local_80->contextLimit = local_80->contextLimit + iVar5;
    iVar9 = iVar5 + local_80->limit;
    local_80->limit = iVar9;
    if ((char)local_74 != '\0') {
      iVar9 = iVar10 + iVar5;
    }
    local_80->start = iVar9;
    umtx_lock_63((UMutex *)0x0);
    if ((((LocalPointer<icu_63::BreakIterator> *)(local_8c._4_8_ + 0x58))->
        super_LocalPointerBase<icu_63::BreakIterator>).ptr == (BreakIterator *)0x0) {
      (((LocalPointer<icu_63::BreakIterator> *)(local_8c._4_8_ + 0x58))->
      super_LocalPointerBase<icu_63::BreakIterator>).ptr = pBVar8;
      pBVar8 = (BreakIterator *)0x0;
    }
    if ((((LocalPointer<icu_63::UVector32> *)(local_8c._4_8_ + 0x60))->
        super_LocalPointerBase<icu_63::UVector32>).ptr == (UVector32 *)0x0) {
      (((LocalPointer<icu_63::UVector32> *)(local_8c._4_8_ + 0x60))->
      super_LocalPointerBase<icu_63::UVector32>).ptr = this_00;
      this_00 = (UVector32 *)0x0;
    }
    umtx_unlock_63((UMutex *)0x0);
    icu_63::UnicodeString::~UnicodeString(&local_70);
  }
  if (this_00 != (UVector32 *)0x0) {
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
  if (pBVar8 != (BreakIterator *)0x0) {
    (*(pBVar8->super_UObject)._vptr_UObject[1])(pBVar8);
  }
  return;
}

Assistant:

void BreakTransliterator::handleTransliterate(Replaceable& text, UTransPosition& offsets,
                                                    UBool isIncremental ) const {

        UErrorCode status = U_ZERO_ERROR;
        LocalPointer<BreakIterator> bi;
        LocalPointer<UVector32> boundaries;

        {
            Mutex m;
            BreakTransliterator *nonConstThis = const_cast<BreakTransliterator *>(this);
            boundaries.moveFrom(nonConstThis->cachedBoundaries);
            bi.moveFrom(nonConstThis->cachedBI);
        }
        if (bi.isNull()) {
            bi.adoptInstead(BreakIterator::createWordInstance(Locale::getEnglish(), status));
        }
        if (boundaries.isNull()) {
            boundaries.adoptInstead(new UVector32(status));
        }

        if (bi.isNull() || boundaries.isNull() || U_FAILURE(status)) {
            return;
        }

        boundaries->removeAllElements();
        UnicodeString sText = replaceableAsString(text);
        bi->setText(sText);
        bi->preceding(offsets.start);

        // To make things much easier, we will stack the boundaries, and then insert at the end.
        // generally, we won't need too many, since we will be filtered.

        int32_t boundary;
        for(boundary = bi->next(); boundary != UBRK_DONE && boundary < offsets.limit; boundary = bi->next()) {
            if (boundary == 0) continue;
            // HACK: Check to see that preceeding item was a letter

            UChar32 cp = sText.char32At(boundary-1);
            int type = u_charType(cp);
            //System.out.println(Integer.toString(cp,16) + " (before): " + type);
            if ((U_MASK(type) & (U_GC_L_MASK | U_GC_M_MASK)) == 0) continue;

            cp = sText.char32At(boundary);
            type = u_charType(cp);
            //System.out.println(Integer.toString(cp,16) + " (after): " + type);
            if ((U_MASK(type) & (U_GC_L_MASK | U_GC_M_MASK)) == 0) continue;

            boundaries->addElement(boundary, status);
            // printf("Boundary at %d\n", boundary);
        }

        int delta = 0;
        int lastBoundary = 0;

        if (boundaries->size() != 0) { // if we found something, adjust
            delta = boundaries->size() * fInsertion.length();
            lastBoundary = boundaries->lastElementi();

            // we do this from the end backwards, so that we don't have to keep updating.

            while (boundaries->size() > 0) {
                boundary = boundaries->popi();
                text.handleReplaceBetween(boundary, boundary, fInsertion);
            }
        }

        // Now fix up the return values
        offsets.contextLimit += delta;
        offsets.limit += delta;
        offsets.start = isIncremental ? lastBoundary + delta : offsets.limit;

        // Return break iterator & boundaries vector to the cache.
        {
            Mutex m;
            BreakTransliterator *nonConstThis = const_cast<BreakTransliterator *>(this);
            if (nonConstThis->cachedBI.isNull()) {
                nonConstThis->cachedBI.moveFrom(bi);
            }
            if (nonConstThis->cachedBoundaries.isNull()) {
                nonConstThis->cachedBoundaries.moveFrom(boundaries);
            }
        }

        // TODO:  do something with U_FAILURE(status);
        //        (need to look at transliterators overall, not just here.)
}